

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

int __thiscall HModel::util_convertWorkingToBaseStat(HModel *this,int *cstat,int *rstat)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  int in_EAX;
  long lVar6;
  int var;
  ulong uVar7;
  int iVar8;
  
  if (cstat != (int *)0x0) {
    bVar4 = 0 < this->numCol;
    if (0 < this->numCol) {
      uVar7 = 0;
      do {
        if ((this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7] == 0) {
          cstat[uVar7] = 1;
LAB_0012f64c:
          bVar5 = true;
        }
        else {
          iVar8 = (this->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar7];
          if (iVar8 != -1) {
            if (iVar8 == 0) {
              dVar2 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar7];
              pdVar1 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar7;
              if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
                cstat[uVar7] = 3;
                goto LAB_0012f64c;
              }
            }
            else if ((iVar8 != 1) ||
                    ((this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar7] <= -1e+200)) goto LAB_0012f614;
            cstat[uVar7] = 0;
            goto LAB_0012f64c;
          }
          if ((this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7] < 1e+200) {
            cstat[uVar7] = 2;
            goto LAB_0012f64c;
          }
LAB_0012f614:
          printf("Invalid basis status: col=%d, nonbasicFlag=%d, nonbasicMove=%d, lower=%g, upper=%g\n"
                 ,(this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar7],
                 (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar7],uVar7 & 0xffffffff);
          in_EAX = (int)uVar7 + 1;
          bVar5 = false;
        }
        if (!bVar5) break;
        uVar7 = uVar7 + 1;
        bVar4 = (long)uVar7 < (long)this->numCol;
      } while ((long)uVar7 < (long)this->numCol);
    }
    if (bVar4) {
      return in_EAX;
    }
  }
  if (rstat != (int *)0x0) {
    bVar4 = 0 < this->numRow;
    if (0 < this->numRow) {
      iVar8 = -1;
      uVar7 = 0;
      do {
        lVar6 = (long)this->numCol + uVar7;
        if ((this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar6] == 0) {
          rstat[uVar7] = 1;
LAB_0012f774:
          bVar5 = true;
        }
        else {
          iVar3 = (this->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6];
          if (iVar3 != 1) {
            if (iVar3 == 0) {
              dVar2 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar7];
              pdVar1 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar7;
              if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
                rstat[uVar7] = 3;
                goto LAB_0012f774;
              }
            }
            else if ((iVar3 != -1) ||
                    ((this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar7] <= -1e+200)) goto LAB_0012f73e;
            rstat[uVar7] = 0;
            goto LAB_0012f774;
          }
          if ((this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7] < 1e+200) {
            rstat[uVar7] = 2;
            goto LAB_0012f774;
          }
LAB_0012f73e:
          printf("Invalid basis status: row=%d, nonbasicFlag=%d, nonbasicMove=%d, lower=%g, upper=%g\n"
                 ,(this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar7],
                 (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar7],uVar7 & 0xffffffff);
          bVar5 = false;
          in_EAX = iVar8;
        }
        if (!bVar5) break;
        uVar7 = uVar7 + 1;
        iVar8 = iVar8 + -1;
        bVar4 = (long)uVar7 < (long)this->numRow;
      } while ((long)uVar7 < (long)this->numRow);
    }
    if (bVar4) {
      return in_EAX;
    }
  }
  return 0;
}

Assistant:

int HModel::util_convertWorkingToBaseStat(int* cstat, int* rstat) {
  if (cstat != NULL)
    {
      for (int col = 0; col < numCol; col++) {
	int var = col;
	if (!nonbasicFlag[var]) {
	  cstat[col] = HSOL_BASESTAT_BASIC;
	  continue;
	}
	else if (nonbasicMove[var] == NONBASIC_MOVE_UP) 
	  {
#ifdef H2DEBUG
	    if (!hsol_isInfinity(-colLower[col])) 
#endif
	      {
		cstat[col] = HSOL_BASESTAT_LOWER;
		continue;
	      }
	  }
	else if (nonbasicMove[var] == NONBASIC_MOVE_DN)
	  {
#ifdef H2DEBUG
            if (!hsol_isInfinity(colUpper[col])) 
#endif
	      {
		cstat[col] = HSOL_BASESTAT_UPPER;
		continue;
	      }
	  }
	else if (nonbasicMove[var] == NONBASIC_MOVE_ZE)
	  {
            if (colLower[col] == colUpper[col])
	      {
#ifndef H2DEBUG
		if (!hsol_isInfinity(colUpper[col]))
#endif
		  {
		    cstat[col] = HSOL_BASESTAT_LOWER;
		    continue;
		  }
	      }
            else
	      {
#ifndef H2DEBUG
		if (hsol_isInfinity(-colLower[col]) && hsol_isInfinity(colLower[col]))
#endif
		  {
		    cstat[col] = HSOL_BASESTAT_ZERO;
		    continue;
		  }
	      }
	  }
#ifdef JAJH_dev
	printf("Invalid basis status: col=%d, nonbasicFlag=%d, nonbasicMove=%d, lower=%g, upper=%g\n",
	       col, nonbasicFlag[var], nonbasicMove[var], colLower[col], colUpper[col]);
#endif
	return col+1;
      }
    }
  if (rstat != NULL)
    {
      for (int row = 0; row < numRow; row++) {
	int var = numCol+row;
	if (!nonbasicFlag[var]) {
	  rstat[row] = HSOL_BASESTAT_BASIC;
	  continue;
	}
	//NB nonbasicMove for rows refers to the solver's view where the bounds are switched and negated
	else if (nonbasicMove[var] == NONBASIC_MOVE_DN)
	  //Free to move only down from -rowLower[row]
	  {
#ifdef H2DEBUG
	    if (!hsol_isInfinity(-rowLower[row])) 
#endif
	      {
		rstat[row] = HSOL_BASESTAT_LOWER;
		continue;
	      }
	  }
	else if (nonbasicMove[var] == NONBASIC_MOVE_UP)
	  //Free to move only up from -rowUpper[row]
	  {
#ifdef H2DEBUG
            if (!hsol_isInfinity(rowUpper[row])) 
#endif
	      {
		rstat[row] = HSOL_BASESTAT_UPPER;
		continue;
	      }
	  }
	else if (nonbasicMove[var] == NONBASIC_MOVE_ZE)
	  {
            if (rowLower[row] == rowUpper[row])
	      {
#ifndef H2DEBUG
		if (!hsol_isInfinity(rowUpper[row]))
#endif
		  {
		    rstat[row] = HSOL_BASESTAT_LOWER;
		    continue;
		  }
	      }
            else
	      {
#ifndef H2DEBUG
		if (hsol_isInfinity(-rowLower[row]) && hsol_isInfinity(rowLower[row]))
#endif
		  {
		    rstat[row] = HSOL_BASESTAT_ZERO;
		    continue;
		  }
	      }
	  }
#ifdef JAJH_dev
	printf("Invalid basis status: row=%d, nonbasicFlag=%d, nonbasicMove=%d, lower=%g, upper=%g\n",
	       row, nonbasicFlag[var], nonbasicMove[var], rowLower[row], rowUpper[row]);
#endif
	return -(row+1);
      }
    }
  return 0;
}